

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

void lws_filename_purify_inplace(char *filename)

{
  do {
    if (*filename == 0x2e) {
      if (((byte *)filename)[1] == 0x2e) {
        ((byte *)filename)[0] = 0x5f;
        ((byte *)filename)[1] = 0x5f;
      }
    }
    else if (*filename == 0) {
      return;
    }
    if (((byte)*filename - 0x24 < 0x39) &&
       ((0x100000000400003U >> ((ulong)((byte)*filename - 0x24) & 0x3f) & 1) != 0)) {
      *filename = 0x5f;
    }
    filename = (char *)((byte *)filename + 1);
  } while( true );
}

Assistant:

void
lws_filename_purify_inplace(char *filename)
{
	while (*filename) {

		if (*filename == '.' && filename[1] == '.') {
			*filename = '_';
			filename[1] = '_';
		}

		if (*filename == ':' ||
		    *filename == '\\' ||
		    *filename == '$' ||
		    *filename == '%')
			*filename = '_';

		filename++;
	}
}